

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O2

void __thiscall
ConfidentialTxInReference_EstimateTxInSize_Test::ConfidentialTxInReference_EstimateTxInSize_Test
          (ConfidentialTxInReference_EstimateTxInSize_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_005c8d68;
  return;
}

Assistant:

TEST(ConfidentialTxInReference, EstimateTxInSize) {
  static const std::string multisig_script = "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae";
  static const std::string scriptsig_template = "00473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb014752210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec552ae";

  Amount issue_amount(uint32_t{10000000});
  Amount token_amount(uint32_t{10000000});
  ConfidentialTxIn txin;
  ConfidentialTxIn pegin_txin;
  {
    pegin_txin.AddPeginWitnessStack(ByteData("00e1f50500000000"));
    pegin_txin.AddPeginWitnessStack(
        ByteData(
            "c23bd031406aa9f7ac994f7385cd8d2605adaadf5a473c82557b4586192681d3"));
    pegin_txin.AddPeginWitnessStack(
        ByteData(
            "06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f"));
    pegin_txin.AddPeginWitnessStack(
        ByteData("0014e8d28b573816ddfcf98578d7b28543e273f5a72a"));
    pegin_txin.AddPeginWitnessStack(
        ByteData(
            "02000000014578ddc14da3e19445b6e7b4c61d4af711d29e2703161aa9c11e4e6b0ea08843010000006b483045022100eea27e89c3cf2867393263bece040f34c03e0cddfa93a1a18c0d2e4322a37df7022074273c0ab3836affba53737c83673ca6c0d69bffdf722b4accfd7c0a9b2ea4e60121020bfcdbda850cd250c3995dfdb426dc40a9c8a5b378be2bf39f6b0642a783daf2feffffff02281d2418010000001976a914b56872c7b363bfb3f5af84d071ff282cf2abfe3988ac00e1f5050000000017a9141d4796c6e855ae00acecb0c20f65dd8bbeffb1ec87d1000000"));
    pegin_txin.AddPeginWitnessStack(
        ByteData(
            "03000030ffba1d575800bf37a1ee1962dee7e153c18bcfc93cd013e7c297d5363b36cc2d63d5c4a9fdc746b9d3f4f62995d611c34ee9740ff2b5193ce458fdac6d173800ec402e5affff7f200500000002000000027ce06590120cf8c2bef7726200f0fa655940cadcf62708d7dc9f8f2a417c890b81af4d4299758e7e7a0daa6e7e3d3ec37f97df4ef2392ae5e6d286fc5e7e01d90105"));
  }
  ConfidentialTxIn issue_txin;
  ConfidentialTxIn reissue_txin;
  ConfidentialValue issuance_amount(issue_amount);
  ConfidentialValue inflation_keys(token_amount);
  BlindFactor entropy("6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306");
  BlindFactor blind_factor("c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf");
  {
    issue_txin.SetIssuance(
        ByteData256(), ByteData256(), issuance_amount,
        inflation_keys, ByteData(), ByteData());
    reissue_txin.SetIssuance(
        entropy.GetData(), blind_factor.GetData(), issuance_amount,
        ConfidentialValue(), ByteData(), ByteData());
  }

  const std::vector<TestEstimateConfidentialTxInRefVector> test_vector = {
    {txin, AddressType::kP2pkhAddress, 150, 0, Script(), Script(), false, "", 0, 0},
    {txin, AddressType::kP2shAddress, 205, 0, exp_script, Script(), false, "", 0, 0},
    {txin, AddressType::kP2shP2wpkhAddress, 176, 112, Script(), Script(), false, "", 0, 0},
    {txin, AddressType::kP2shP2wshAddress, 222, 146, Script("51"), Script(), false, "", 0, 0},
    {txin, AddressType::kP2wpkhAddress, 153, 112, Script(), Script(), false, "", 0, 0},
    {txin, AddressType::kP2wshAddress, 208, 167, exp_script,Script(), false, "", 0, 0},
    {txin, AddressType::kP2wshAddress, 301, 260, Script(multisig_script), Script(), false,
      "", 0, 0},
    {txin, AddressType::kP2wshAddress, 191, 150, exp_script, Script(), false,
      scriptsig_template, 0, 0},
    // pegin (input claim script)
    {pegin_txin, AddressType::kP2wpkhAddress, 644, 603, Script(),
     Script("0020e8d28b573816ddfcf98578d7b28543e273f5a72a112233445566778899aabbccdd"),
     false, "", 0, 0},
    // issue
    {issue_txin, AddressType::kP2wpkhAddress, 4143, 3972, Script(), Script(), true, "", 0, 0},
    {issue_txin, AddressType::kP2wpkhAddress, 6065, 5894, Script(), Script(), true, "", 0, 36},
    {issue_txin, AddressType::kP2wpkhAddress, 8627, 8456, Script(), Script(), true, "", 0, 52},
    // reissue
    {reissue_txin, AddressType::kP2wpkhAddress, 3174, 3003, Script(), Script(), true, "", 0, 36},
    {reissue_txin, AddressType::kP2wpkhAddress, 4455, 4284, Script(),Script(), true, "", 0, 52},
  };

  for (const auto& test_data : test_vector) {
    uint32_t size = 0;
    uint32_t wit_size = 0;
    Script script_template(test_data.script_template);
    Script* template_ptr = nullptr;
    if (!test_data.script_template.empty()) {
      template_ptr = &script_template;
    }
    ConfidentialTxInReference txin_ref(test_data.txin);
    EXPECT_NO_THROW((size = txin_ref.EstimateTxInSize(
        test_data.addr_type, test_data.redeem_script, test_data.is_blind,
        test_data.exponent, test_data.minimum_bits, test_data.claim_script,
        template_ptr, &wit_size, nullptr)));
    EXPECT_EQ(size, test_data.size);
    EXPECT_EQ(wit_size, test_data.witness_size);
  }
}